

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestETCaptureCoverage::~TestETCaptureCoverage(TestETCaptureCoverage *this)

{
  TestETCaptureCoverage *this_local;
  
  testinator::Test::~Test(&this->super_Test);
  return;
}

Assistant:

DEF_TEST(ETCaptureCoverage, Test)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestETCaptureCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected = "EXPECT FAILED";
  return oss.str().find(expected) != string::npos;
}